

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O2

void __thiscall FRandom::FRandom(FRandom *this)

{
  this->NameCRC = 0;
  this->Name = (char *)0x0;
  this->initialized = false;
  this->Next = RNGList;
  RNGList = this;
  return;
}

Assistant:

FRandom::FRandom ()
: NameCRC (0)
{
#ifndef NDEBUG
	Name = NULL;
	initialized = false;
#endif
	Next = RNGList;
	RNGList = this;
}